

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

int licm(gen_ctx_t gen_ctx)

{
  loop_node_t_conflict local_20;
  loop_node_t_conflict node;
  gen_ctx_t gen_ctx_local;
  
  for (local_20 = DLIST_loop_node_t_head(&gen_ctx->curr_cfg->root_loop_node->children);
      (local_20 != (loop_node_t_conflict)0x0 && (local_20->bb != (bb_t)0x0));
      local_20 = DLIST_loop_node_t_next(local_20)) {
  }
  if (local_20 == (loop_node_t_conflict)0x0) {
    gen_ctx_local._4_4_ = 0;
  }
  else {
    licm_add_loop_preheaders(gen_ctx,gen_ctx->curr_cfg->root_loop_node);
    gen_ctx_local._4_4_ = loop_licm(gen_ctx,gen_ctx->curr_cfg->root_loop_node);
  }
  return gen_ctx_local._4_4_;
}

Assistant:

static int licm (gen_ctx_t gen_ctx) {
  loop_node_t node;
  for (node = DLIST_HEAD (loop_node_t, curr_cfg->root_loop_node->children); node != NULL;
       node = DLIST_NEXT (loop_node_t, node))
    if (node->bb == NULL) break;
  if (node == NULL) return FALSE; /* no loops */
  licm_add_loop_preheaders (gen_ctx, curr_cfg->root_loop_node);
  return loop_licm (gen_ctx, curr_cfg->root_loop_node);
}